

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O2

int point_mul_two_id_GostR3410_2001_TestParamSet
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  uint64_t *output;
  uint64_t *out1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  long lVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  pt_prj_t_conflict Q;
  uchar b_y [32];
  uchar b_x [32];
  uchar b_m [32];
  uchar b_n [32];
  pt_aff_t_conflict local_898;
  int8_t bnaf [257];
  int8_t anaf [257];
  pt_prj_t_conflict local_638 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  pBVar8 = BN_CTX_get((BN_CTX *)ctx);
  iVar5 = 0;
  iVar6 = 0;
  if (((((pBVar8 != (BIGNUM *)0x0) &&
        (iVar4 = EC_POINT_get_affine_coordinates(group,q,pBVar7,pBVar8,ctx), iVar4 != 0)) &&
       (iVar4 = BN_bn2lebinpad(pBVar7,b_x,0x20), iVar6 = iVar5, iVar4 == 0x20)) &&
      ((iVar5 = BN_bn2lebinpad(pBVar8,b_y,0x20), iVar5 == 0x20 &&
       (iVar5 = BN_bn2lebinpad(n,b_n,0x20), iVar5 == 0x20)))) &&
     (iVar5 = BN_bn2lebinpad(m,b_m,0x20), iVar5 == 0x20)) {
    fiat_id_GostR3410_2001_TestParamSet_from_bytes(local_898.X,b_x);
    puVar1 = local_898.Y;
    fiat_id_GostR3410_2001_TestParamSet_from_bytes(puVar1,b_y);
    fiat_id_GostR3410_2001_TestParamSet_to_montgomery(local_898.X,local_898.X);
    fiat_id_GostR3410_2001_TestParamSet_to_montgomery(puVar1,puVar1);
    memset(anaf,0,0x101);
    memset(bnaf,0,0x101);
    Q.Z[2] = 0;
    Q.Z[3] = 0;
    Q.Z[0] = 0;
    Q.Z[1] = 0;
    Q.Y[2] = 0;
    Q.Y[3] = 0;
    Q.Y[0] = 0;
    Q.Y[1] = 0;
    Q.X[2] = 0;
    Q.X[3] = 0;
    Q.X[0] = 0;
    Q.X[1] = 0;
    precomp_wnaf(local_638,&local_898);
    scalar_wnaf(anaf,b_n);
    scalar_wnaf(bnaf,b_m);
    bVar11 = 0;
    bVar3 = true;
    for (uVar12 = 0x100; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
      if (!bVar3) {
        point_double(&Q,&Q);
      }
      bVar2 = bnaf[uVar12];
      if (bVar2 != 0) {
        if (bVar11 != bVar2 >> 7) {
          fiat_id_GostR3410_2001_TestParamSet_opp(Q.Y,Q.Y);
          bVar11 = bVar11 ^ 1;
        }
        uVar10 = (int)((int)(char)bVar2 - 1U) >> 1;
        if ((char)bVar2 < '\0') {
          uVar10 = (uint)~(int)(char)bVar2 >> 1;
        }
        if (bVar3) {
          Q.X[0] = local_638[(int)uVar10].X[0];
          Q.X[1] = local_638[(int)uVar10].X[1];
          Q.X[2] = local_638[(int)uVar10].X[2];
          Q.X[3] = local_638[(int)uVar10].X[3];
          Q.Y[0] = local_638[(int)uVar10].Y[0];
          Q.Y[1] = local_638[(int)uVar10].Y[1];
          Q.Y[2] = local_638[(int)uVar10].Y[2];
          Q.Y[3] = local_638[(int)uVar10].Y[3];
          Q.Z[2] = local_638[(int)uVar10].Z[2];
          Q.Z[3] = local_638[(int)uVar10].Z[3];
          Q.Z[0] = CONCAT44(*(undefined4 *)((long)local_638[(int)uVar10].Z + 4),
                            (int)local_638[(int)uVar10].Z[0]);
          Q.Z[1] = CONCAT44(*(undefined4 *)((long)local_638[(int)uVar10].Z + 0xc),
                            (int)local_638[(int)uVar10].Z[1]);
        }
        else {
          point_add_proj(&Q,&Q,local_638 + (int)uVar10);
        }
        bVar3 = false;
      }
      bVar2 = anaf[uVar12];
      if (bVar2 != 0) {
        if (bVar11 != bVar2 >> 7) {
          fiat_id_GostR3410_2001_TestParamSet_opp(Q.Y,Q.Y);
          bVar11 = bVar11 ^ 1;
        }
        uVar10 = (int)((int)(char)bVar2 - 1U) >> 1;
        if ((char)bVar2 < '\0') {
          uVar10 = (uint)~(int)(char)bVar2 >> 1;
        }
        if (bVar3) {
          Q.X[0] = lut_cmb[0][(int)uVar10].X[0];
          Q.X[1] = lut_cmb[0][(int)uVar10].X[1];
          Q.X[2] = lut_cmb[0][(int)uVar10].X[2];
          Q.X[3] = lut_cmb[0][(int)uVar10].X[3];
          Q.Y[0] = lut_cmb[0][(int)uVar10].Y[0];
          Q.Y[1] = lut_cmb[0][(int)uVar10].Y[1];
          Q.Y[2] = lut_cmb[0][(int)uVar10].Y[2];
          Q.Y[3] = lut_cmb[0][(int)uVar10].Y[3];
          Q.Z[0] = 0xfffffffffffffbcf;
          Q.Z[1] = 0xffffffffffffffff;
          Q.Z[2] = 0xffffffffffffffff;
          Q.Z[3] = 0x7fffffffffffffff;
        }
        else {
          point_add_mixed(&Q,&Q,lut_cmb[0] + (int)uVar10);
        }
        bVar3 = false;
      }
    }
    puVar1 = Q.Y;
    if (bVar3) {
      Q.X[2] = 0;
      Q.X[3] = 0;
      Q.X[0] = 0;
      Q.X[1] = 0;
      Q.Y[2] = 0xffffffffffffffff;
      Q.Y[3] = 0x7fffffffffffffff;
      Q.Y[0] = 0xfffffffffffffbcf;
      Q.Y[1] = 0xffffffffffffffff;
      Q.Z[0] = 0;
      Q.Z[1] = 0;
      Q.Z[2] = 0;
      Q.Z[3] = 0;
    }
    if (bVar11 != 0) {
      fiat_id_GostR3410_2001_TestParamSet_opp(puVar1,puVar1);
    }
    output = Q.Z;
    fiat_id_GostR3410_2001_TestParamSet_inv(output,output);
    fiat_id_GostR3410_2001_TestParamSet_mul(local_898.X,Q.X,output);
    out1 = local_898.Y;
    fiat_id_GostR3410_2001_TestParamSet_mul(out1,puVar1,output);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(local_898.X,local_898.X);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(out1,out1);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(b_x,local_898.X);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(b_y,out1);
    iVar6 = CRYPTO_memcmp("",b_x,0x20);
    if ((iVar6 == 0) && (iVar6 = CRYPTO_memcmp("",b_y,0x20), iVar6 == 0)) {
      iVar6 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar6 == 0) {
        iVar6 = 0;
        goto LAB_0012bd99;
      }
    }
    else {
      lVar9 = BN_lebin2bn(b_x,0x20,pBVar7);
      iVar6 = 0;
      if ((lVar9 == 0) ||
         ((lVar9 = BN_lebin2bn(b_y,0x20,pBVar8), lVar9 == 0 ||
          (iVar5 = EC_POINT_set_affine_coordinates(group,r,pBVar7,pBVar8,ctx), iVar5 == 0))))
      goto LAB_0012bd99;
    }
    iVar6 = 1;
  }
LAB_0012bd99:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar6;
}

Assistant:

int
    point_mul_two_id_GostR3410_2001_TestParamSet(const EC_GROUP *group,
                                                 EC_POINT *r, const BIGNUM *n,
                                                 const EC_POINT *q,
                                                 const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(n, b_n, 32) != 32 || BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}